

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_audio.h
# Opt level: O0

wchar_t saudio_push(float *frames,wchar_t num_frames)

{
  wchar_t wVar1;
  int num_written;
  int num_bytes;
  wchar_t num_frames_local;
  float *frames_local;
  
  if ((frames != (float *)0x0) && (L'\0' < num_frames)) {
    if (_saudio.valid) {
      wVar1 = _saudio_fifo_write(&_saudio.fifo,(uint8_t *)frames,
                                 num_frames * _saudio.bytes_per_frame);
      frames_local._4_4_ = wVar1 / _saudio.bytes_per_frame;
    }
    else {
      frames_local._4_4_ = L'\0';
    }
    return frames_local._4_4_;
  }
  __assert_fail("frames && (num_frames > 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_audio.h"
                ,0x84f,"int saudio_push(const float *, int)");
}

Assistant:

SOKOL_API_IMPL int saudio_push(const float* frames, int num_frames) {
    SOKOL_ASSERT(frames && (num_frames > 0));
    if (_saudio.valid) {
        const int num_bytes = num_frames * _saudio.bytes_per_frame;
        const int num_written = _saudio_fifo_write(&_saudio.fifo, (const uint8_t*)frames, num_bytes);
        return num_written / _saudio.bytes_per_frame;
    }
    else {
        return 0;
    }
}